

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O2

void __thiscall E64::host_t::video_change_scanlines_intensity(host_t *this)

{
  byte bVar1;
  uint8_t uVar2;
  undefined8 uVar3;
  
  bVar1 = this->settings->video_scanlines_alpha;
  if (bVar1 < 0x40) {
    uVar3 = 0x40;
    uVar2 = '@';
  }
  else if ((char)bVar1 < '\0') {
    if (bVar1 < 0xc0) {
      uVar3 = 0xc0;
      uVar2 = 0xc0;
    }
    else {
      uVar3 = 0xff;
      if (bVar1 == 0xff) {
        uVar3 = 0;
      }
      uVar2 = -(bVar1 != 0xff);
    }
  }
  else {
    uVar3 = 0x80;
    uVar2 = 0x80;
  }
  this->settings->video_scanlines_alpha = uVar2;
  hud_t::show_notification(this->hud,"Scanlines alpha value = %3u",uVar3);
  return;
}

Assistant:

void E64::host_t::video_change_scanlines_intensity()
{
	if (settings->video_scanlines_alpha < 64) {
		settings->video_scanlines_alpha = 64;
	} else if (settings->video_scanlines_alpha < 128) {
		settings->video_scanlines_alpha = 128;
	} else if (settings->video_scanlines_alpha < 192) {
		settings->video_scanlines_alpha = 192;
	} else if (settings->video_scanlines_alpha < 255) {
		settings->video_scanlines_alpha = 255;
	} else {
		settings->video_scanlines_alpha = 0;
	}
	hud->show_notification("Scanlines alpha value = %3u", settings->video_scanlines_alpha);
}